

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O2

int __thiscall cmCPackArchiveGenerator::PackageComponentsAllInOne(cmCPackArchiveGenerator *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmCPackLog *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  int iVar6;
  char *local_4e8 [4];
  ostringstream cmCPackLog_msg_1;
  cmArchiveWrite archive;
  cmGeneratedFileStream gf;
  
  this_00 = &(this->super_cmCPackGenerator).packageFileNames;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(this_00);
  std::__cxx11::string::string((string *)&gf,(string *)&(this->super_cmCPackGenerator).toplevel);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gf);
  std::__cxx11::string::~string((string *)&gf);
  std::__cxx11::string::append
            ((char *)(this_00->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::string
            ((string *)&gf,"CPACK_ARCHIVE_FILE_NAME",(allocator *)&cmCPackLog_msg_1);
  bVar2 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)&gf);
  std::__cxx11::string::~string((string *)&gf);
  if (bVar2) {
    std::__cxx11::string::string
              ((string *)&gf,"CPACK_ARCHIVE_FILE_NAME",(allocator *)&cmCPackLog_msg_1);
    cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gf);
    std::__cxx11::string::append
              ((char *)(this_00->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
  }
  else {
    std::__cxx11::string::string
              ((string *)&gf,"CPACK_PACKAGE_FILE_NAME",(allocator *)&cmCPackLog_msg_1);
    cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&gf);
    std::__cxx11::string::append
              ((char *)(this_00->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
  }
  std::__cxx11::string::~string((string *)&gf);
  (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[4])(this);
  std::__cxx11::string::append
            ((char *)(this->super_cmCPackGenerator).packageFileNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&gf);
  poVar4 = std::operator<<((ostream *)&gf,
                           "Packaging all groups in one package...(CPACK_COMPONENTS_ALL_GROUPS_IN_ONE_PACKAGE is set)"
                          );
  std::endl<char,std::char_traits<char>>(poVar4);
  pcVar1 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar1,2,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                  ,0xd8,_cmCPackLog_msg_1);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&gf);
  cmGeneratedFileStream::cmGeneratedFileStream(&gf,None);
  iVar6 = 1;
  cmGeneratedFileStream::Open
            (&gf,(((this_00->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,false,true);
  iVar3 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1b])(this,&gf);
  if (iVar3 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_1);
    poVar4 = std::operator<<((ostream *)&cmCPackLog_msg_1,
                             "Problem to generate Header for archive < ");
    poVar4 = std::operator<<(poVar4,(string *)
                                    (this_00->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start);
    poVar4 = std::operator<<(poVar4,">.");
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                    ,0xd9,(char *)archive.Stream);
    std::__cxx11::string::~string((string *)&archive);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg_1);
    iVar6 = 0;
  }
  else {
    cmArchiveWrite::cmArchiveWrite(&archive,(ostream *)&gf,this->Compress,&this->ArchiveFormat);
    if (archive.Error._M_string_length == 0) {
      for (p_Var5 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                    _M_header._M_left;
          (_Rb_tree_header *)p_Var5 !=
          &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
        addOneComponentToArchive(this,&archive,(cmCPackComponent *)(p_Var5 + 2));
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_1);
      poVar4 = std::operator<<((ostream *)&cmCPackLog_msg_1,"Problem to create archive < ");
      poVar4 = std::operator<<(poVar4,(string *)
                                      (this_00->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start);
      poVar4 = std::operator<<(poVar4,">. ERROR =");
      std::__cxx11::string::string((string *)local_4e8,(string *)&archive.Error);
      poVar4 = std::operator<<(poVar4,(string *)local_4e8);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)local_4e8);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                      ,0xd9,local_4e8[0]);
      std::__cxx11::string::~string((string *)local_4e8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg_1);
      iVar6 = 0;
    }
    cmArchiveWrite::~cmArchiveWrite(&archive);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&gf);
  return iVar6;
}

Assistant:

int cmCPackArchiveGenerator::PackageComponentsAllInOne()
{
  // reset the package file names
  packageFileNames.clear();
  packageFileNames.push_back(std::string(toplevel));
  packageFileNames[0] += "/";

  if (this->IsSet("CPACK_ARCHIVE_FILE_NAME")) {
    packageFileNames[0] += this->GetOption("CPACK_ARCHIVE_FILE_NAME");
  } else {
    packageFileNames[0] += this->GetOption("CPACK_PACKAGE_FILE_NAME");
  }

  packageFileNames[0] += this->GetOutputExtension();

  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Packaging all groups in one package..."
                "(CPACK_COMPONENTS_ALL_GROUPS_IN_ONE_PACKAGE is set)"
                  << std::endl);
  DECLARE_AND_OPEN_ARCHIVE(packageFileNames[0], archive);

  // The ALL COMPONENTS in ONE package case
  std::map<std::string, cmCPackComponent>::iterator compIt;
  for (compIt = this->Components.begin(); compIt != this->Components.end();
       ++compIt) {
    // Add the files of this component to the archive
    addOneComponentToArchive(archive, &(compIt->second));
  }

  // archive goes out of scope so it will finalized and closed.
  return 1;
}